

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O2

CURLcode imap_perform_authentication(connectdata *conn)

{
  CURLcode CVar1;
  imapstate state2;
  imapstate state1;
  char *local_28;
  char *mech;
  size_t len;
  
  mech = (char *)0x0;
  local_28 = (char *)0x0;
  len = 0;
  state1 = IMAP_STOP;
  state2 = IMAP_STOP;
  if ((conn->bits).user_passwd == false) {
    (conn->proto).imapc.state = IMAP_STOP;
    CVar1 = CURLE_OK;
  }
  else {
    CVar1 = imap_calc_sasl_details(conn,&mech,&local_28,&len,&state1,&state2);
    if (CVar1 == CURLE_OK) {
      if ((mech == (char *)0x0) || ((*(byte *)((long)&conn->proto + 0x7c) & 2) == 0)) {
        if (((conn->proto).ftpc.cwddone == false) &&
           ((*(byte *)((long)&conn->proto + 0x7c) & 1) != 0)) {
          CVar1 = imap_perform_login(conn);
        }
        else {
          Curl_infof(conn->data,"No known authentication mechanisms supported!\n");
          CVar1 = CURLE_LOGIN_DENIED;
        }
      }
      else {
        CVar1 = imap_perform_authenticate(conn,mech,local_28,state1,state2);
        if (local_28 != (char *)0x0) {
          (*Curl_cfree)(local_28);
        }
      }
    }
  }
  return CVar1;
}

Assistant:

static CURLcode imap_perform_authentication(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct imap_conn *imapc = &conn->proto.imapc;
  const char *mech = NULL;
  char *initresp = NULL;
  size_t len = 0;
  imapstate state1 = IMAP_STOP;
  imapstate state2 = IMAP_STOP;

  /* Check we have a username and password to authenticate with and end the
     connect phase if we don't */
  if(!conn->bits.user_passwd) {
    state(conn, IMAP_STOP);

    return result;
  }

  /* Calculate the SASL login details */
  result = imap_calc_sasl_details(conn, &mech, &initresp, &len, &state1,
                                  &state2);

  if(!result) {
    if(mech && (imapc->preftype & IMAP_TYPE_SASL)) {
      /* Perform SASL based authentication */
      result = imap_perform_authenticate(conn, mech, initresp, state1, state2);

      Curl_safefree(initresp);
    }
    else if((!imapc->login_disabled) &&
            (imapc->preftype & IMAP_TYPE_CLEARTEXT))
      /* Perform clear text authentication */
      result = imap_perform_login(conn);
    else {
      /* Other mechanisms not supported */
      infof(conn->data, "No known authentication mechanisms supported!\n");
      result = CURLE_LOGIN_DENIED;
    }
  }

  return result;
}